

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StrfTimeBindFunction<false>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference this_00;
  pointer pEVar2;
  type pEVar3;
  ParameterNotResolvedException *this_01;
  InvalidInputException *pIVar4;
  bool is_null;
  string error;
  string format_string;
  StrfTimeFormat format;
  Value options_str;
  bool local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  pointer local_100;
  pointer pSStack_f8;
  pointer local_f0;
  pointer pbStack_e8;
  pointer local_e0;
  pointer pbStack_d8;
  idx_t local_d0;
  pointer piStack_c8;
  pointer local_c0;
  pointer piStack_b8;
  pointer local_b0;
  pointer pSStack_a8;
  pointer local_a0;
  _Bit_type *p_Stack_98;
  uint local_90;
  _Bit_type *local_88;
  uint local_80;
  _Bit_pointer local_78;
  Value local_70;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar1 = (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[6])(pEVar2);
  if ((char)iVar1 != '\0') {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar1 = (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar2);
  if ((char)iVar1 != '\0') {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this_00);
    ExpressionExecutor::EvaluateScalar(&local_70,context,pEVar3,false);
    Value::GetValue<std::__cxx11::string>(&local_1a8,&local_70);
    local_128._8_8_ = &local_110;
    local_128._16_8_ = 0;
    local_110._M_local_buf[0] = '\0';
    local_100 = (pointer)0x0;
    pSStack_f8 = (pointer)0x0;
    local_f0 = (pointer)0x0;
    pbStack_e8 = (pointer)0x0;
    local_e0 = (pointer)0x0;
    pbStack_d8 = (pointer)0x0;
    local_d0 = 0;
    piStack_c8 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    piStack_b8 = (pointer)0x0;
    local_128._0_8_ = &PTR__StrfTimeFormat_0243d4b0;
    local_88 = (_Bit_type *)0x0;
    local_80 = 0;
    local_78 = (_Bit_pointer)0x0;
    local_b0 = (pointer)0x0;
    pSStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    p_Stack_98 = (_Bit_type *)0x0;
    local_90 = 0;
    local_1c9 = local_70.is_null;
    if (local_70.is_null == false) {
      StrTimeFormat::ParseFormatSpecifier(&local_1c8,&local_1a8,(StrTimeFormat *)local_128);
      if (local_1c8._M_string_length != 0) {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this_00);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"Failed to parse format specifier %s: %s","");
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_1a8._M_dataplus._M_p,
                   local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_1c8._M_dataplus._M_p,
                   local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
        InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar4,pEVar3,&local_188,&local_148,&local_168);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
    }
    make_uniq<duckdb::StrfTimeBindData,duckdb::StrfTimeFormat&,std::__cxx11::string&,bool&>
              ((duckdb *)&local_1c8,(StrfTimeFormat *)local_128,&local_1a8,&local_1c9);
    *(pointer *)this = local_1c8._M_dataplus._M_p;
    local_128._0_8_ = &PTR__StrfTimeFormat_0243d4b0;
    if (p_Stack_98 != (_Bit_type *)0x0) {
      operator_delete(p_Stack_98);
      p_Stack_98 = (_Bit_type *)0x0;
      local_90 = 0;
      local_88 = (_Bit_type *)0x0;
      local_80 = 0;
      local_78 = (_Bit_pointer)0x0;
    }
    if (local_b0 != (pointer)0x0) {
      operator_delete(local_b0);
    }
    StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    Value::~Value(&local_70);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_00);
  local_128._0_8_ = local_128 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"strftime format must be a constant","");
  InvalidInputException::InvalidInputException<>(pIVar4,pEVar3,(string *)local_128);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> StrfTimeBindFunction(ClientContext &context, ScalarFunction &bound_function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto format_idx = REVERSED ? 0U : 1U;
	auto &format_arg = arguments[format_idx];
	if (format_arg->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!format_arg->IsFoldable()) {
		throw InvalidInputException(*format_arg, "strftime format must be a constant");
	}
	Value options_str = ExpressionExecutor::EvaluateScalar(context, *format_arg);
	auto format_string = options_str.GetValue<string>();
	StrfTimeFormat format;
	bool is_null = options_str.IsNull();
	if (!is_null) {
		string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
		if (!error.empty()) {
			throw InvalidInputException(*format_arg, "Failed to parse format specifier %s: %s", format_string, error);
		}
	}
	return make_uniq<StrfTimeBindData>(format, format_string, is_null);
}